

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O2

void udp_example(void)

{
  allocator local_259;
  shared_ptr<spdlog::logger> my_logger;
  udp_sink_config cfg;
  undefined1 local_220 [32];
  char *local_200;
  size_type local_1f8;
  char local_1f0 [8];
  undefined8 uStack_1e8;
  udp_sink_config local_1e0;
  executor local_1b8;
  
  std::__cxx11::string::string((string *)&local_200,"127.0.0.1",(allocator *)local_220);
  cfg.server_host._M_string_length = local_1f8;
  cfg.server_host._M_dataplus._M_p = (pointer)&cfg.server_host.field_2;
  if (local_200 == local_1f0) {
    cfg.server_host.field_2._8_8_ = uStack_1e8;
  }
  else {
    cfg.server_host._M_dataplus._M_p = local_200;
  }
  local_1f8 = 0;
  local_1f0[0] = '\0';
  cfg.server_port = 0x2b53;
  local_200 = local_1f0;
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::string((string *)local_220,"udplog",&local_259);
  spdlog::sinks::udp_sink_config::udp_sink_config(&local_1e0,&cfg);
  spdlog::udp_logger_mt<spdlog::synchronous_factory>
            ((string *)&my_logger,(udp_sink_config *)local_220);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)local_220);
  spdlog::logger::set_level
            (my_logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,debug);
  spdlog::logger::info<char[12]>
            (&local_1b8,
             my_logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (char (*) [12])"hello world");
  spdlog::details::executor::~executor(&local_1b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&my_logger.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&cfg);
  return;
}

Assistant:

void udp_example()
{
    spdlog::sinks::udp_sink_config cfg("127.0.0.1", 11091);
    auto my_logger = spdlog::udp_logger_mt("udplog", cfg);
    my_logger->set_level(spdlog::level::debug);
    my_logger->info("hello world");
}